

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send_mqtt_handshake_opt(mg_connection *nc,char *client_id,mg_send_mqtt_handshake_opts opts)

{
  size_t sVar1;
  uint8_t rem_len;
  uint8_t header;
  uint16_t client_id_len;
  uint16_t keep_alive;
  
  strlen(client_id);
  mg_send(nc,&header,1);
  mg_send(nc,&rem_len,1);
  mg_send(nc,"",9);
  mg_send(nc,&opts,1);
  if (opts.keep_alive == 0) {
    opts.keep_alive = 0x3c;
  }
  mg_send(nc,&keep_alive,2);
  strlen(client_id);
  mg_send(nc,&client_id_len,2);
  sVar1 = strlen(client_id);
  mg_send(nc,client_id,(int)sVar1);
  return;
}

Assistant:

void mg_send_mqtt_handshake_opt(struct mg_connection *nc, const char *client_id,
                                struct mg_send_mqtt_handshake_opts opts) {
    uint8_t header = MG_MQTT_CMD_CONNECT << 4;
    uint8_t rem_len;
    uint16_t keep_alive;
    uint16_t client_id_len;

    /*
   * 9: version_header(len, magic_string, version_number), 1: flags, 2:
   * keep-alive timer,
   * 2: client_identifier_len, n: client_id
   */
    rem_len = 9 + 1 + 2 + 2 + strlen(client_id);

    mg_send(nc, &header, 1);
    mg_send(nc, &rem_len, 1);
    mg_send(nc, "\00\06MQIsdp\03", 9);
    mg_send(nc, &opts.flags, 1);

    if (opts.keep_alive == 0) {
        opts.keep_alive = 60;
    }
    keep_alive = htons(opts.keep_alive);
    mg_send(nc, &keep_alive, 2);

    client_id_len = htons(strlen(client_id));
    mg_send(nc, &client_id_len, 2);
    mg_send(nc, client_id, strlen(client_id));
}